

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

wstring * __thiscall mjs::parser::get_label_abi_cxx11_(wstring *__return_storage_ptr__,parser *this)

{
  wstring *pwVar1;
  socklen_t *in_RCX;
  token t;
  
  if ((0 < (int)this->version_) && (this->line_break_skipped_ == false)) {
    accept((parser *)&t,(int)this,(sockaddr *)0x2,in_RCX);
    if (t.type_ != eof) {
      pwVar1 = token::text_abi_cxx11_(&t);
      std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)pwVar1);
      token::destroy(&t);
      return __return_storage_ptr__;
    }
    token::destroy(&t);
  }
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"",(allocator<wchar_t> *)&t);
  return __return_storage_ptr__;
}

Assistant:

std::wstring get_label() {
        // no line break before
        if (version_ >= version::es3 && !line_break_skipped_) {
            if (auto t = accept(token_type::identifier)) {
                return t.text();
            }
        }
        return L"";
    }